

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O1

void __thiscall
duckdb::DataTable::VerifyDeleteConstraints
          (DataTable *this,optional_ptr<duckdb::LocalTableStorage,_true> storage,
          TableDeleteState *state,ClientContext *context,DataChunk *chunk)

{
  pointer puVar1;
  pointer pCVar2;
  pointer pBVar3;
  BoundForeignKeyConstraint *bound_foreign_key;
  NotImplementedException *this_00;
  pointer this_01;
  string local_50;
  
  pCVar2 = unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true>::
           operator->(&state->constraint_state);
  this_01 = (pCVar2->bound_constraints->
            super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pCVar2->bound_constraints->
           super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_01 == puVar1) {
      return;
    }
    pBVar3 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
             ::operator->(this_01);
    if (2 < pBVar3->type - 1) {
      if (pBVar3->type != FOREIGN_KEY) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Constraint type not implemented!","");
        NotImplementedException::NotImplementedException(this_00,&local_50);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      pBVar3 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_01);
      bound_foreign_key = BoundConstraint::Cast<duckdb::BoundForeignKeyConstraint>(pBVar3);
      if (((bound_foreign_key->info).type & ~FK_TYPE_SELF_REFERENCE_TABLE) ==
          FK_TYPE_PRIMARY_KEY_TABLE) {
        VerifyForeignKeyConstraint(this,storage,bound_foreign_key,context,chunk,DELETE_FK);
      }
    }
    this_01 = this_01 + 1;
  } while( true );
}

Assistant:

void DataTable::VerifyDeleteConstraints(optional_ptr<LocalTableStorage> storage, TableDeleteState &state,
                                        ClientContext &context, DataChunk &chunk) {
	for (auto &constraint : state.constraint_state->bound_constraints) {
		switch (constraint->type) {
		case ConstraintType::NOT_NULL:
		case ConstraintType::CHECK:
		case ConstraintType::UNIQUE:
			break;
		case ConstraintType::FOREIGN_KEY: {
			auto &bound_foreign_key = constraint->Cast<BoundForeignKeyConstraint>();
			if (bound_foreign_key.info.IsDeleteConstraint()) {
				VerifyDeleteForeignKeyConstraint(storage, bound_foreign_key, context, chunk);
			}
			break;
		}
		default:
			throw NotImplementedException("Constraint type not implemented!");
		}
	}
}